

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_function_helpers(t_dart_generator *this,t_function *tfunction)

{
  t_program *program;
  t_type *type;
  t_struct *ptVar1;
  int iVar2;
  pointer pptVar3;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  t_field success;
  t_struct result;
  
  if (tfunction->oneway_ == false) {
    program = (this->super_t_oop_generator).super_t_generator.program_;
    std::__cxx11::string::string((string *)&local_1b8,(string *)&tfunction->name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&success,
                   &local_1b8,"_result");
    t_struct::t_struct(&result,program,(string *)&success);
    std::__cxx11::string::~string((string *)&success);
    std::__cxx11::string::~string((string *)&local_1b8);
    type = tfunction->returntype_;
    std::__cxx11::string::string((string *)&local_1d8,"success",&local_1f9);
    t_field::t_field(&success,type,&local_1d8,0);
    std::__cxx11::string::~string((string *)&local_1d8);
    iVar2 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar2 == '\0') {
      t_struct::append(&result,&success);
    }
    ptVar1 = tfunction->xceptions_;
    for (pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar3 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
      t_struct::append(&result,*pptVar3);
    }
    std::__cxx11::string::string((string *)&local_1f8,"",&local_1f9);
    generate_dart_struct_definition(this,(ostream *)&this->f_service_,&result,false,true,&local_1f8)
    ;
    std::__cxx11::string::~string((string *)&local_1f8);
    t_field::~t_field(&success);
    t_struct::~t_struct(&result);
  }
  return;
}

Assistant:

void t_dart_generator::generate_function_helpers(t_function* tfunction) {
  if (tfunction->is_oneway()) {
    return;
  }

  t_struct result(program_, get_result_class_name(tfunction->get_name()));
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }

  generate_dart_struct_definition(f_service_, &result, false, true);
}